

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

bool cmsys::SystemTools::SetPermissions(char *file,mode_t mode)

{
  bool bVar1;
  size_t sVar2;
  string local_40;
  
  if (file == (char *)0x0) {
    bVar1 = false;
  }
  else {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    sVar2 = strlen(file);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,file,file + sVar2);
    bVar1 = SetPermissions(&local_40,mode);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar1;
}

Assistant:

bool SystemTools::SetPermissions(const char* file, mode_t mode)
{
  if ( !file )
    {
    return false;
    }
  return SystemTools::SetPermissions(kwsys_stl::string(file), mode);
}